

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int add_double_attr(attr_list list,atom_t attr_id,double dvalue)

{
  undefined8 in_R8;
  attr_union value;
  
  value.u.o.buffer = (void *)in_R8;
  value.u.d = dvalue;
  add_pattr(list,attr_id,Attr_Float8,value);
  return 1;
}

Assistant:

extern int
add_double_attr(attr_list list, atom_t attr_id, double dvalue)
{
    attr_value_type t = Attr_Float4;
    attr_union tmp;
    tmp.u.d = dvalue;
    if (sizeof(double) == 8) t = Attr_Float8;
    if (sizeof(double) == 16) t = Attr_Float16;
    return add_pattr(list, attr_id, t, tmp);
}